

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_logo.c
# Opt level: O3

void randomize(void)

{
  int iVar1;
  
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",((double)iVar1 / 2147483647.0) * 10.0 + 2.0);
  strcpy(param_values[3],rnum_s);
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",((double)iVar1 / 2147483647.0) * 7.0 + 1.0);
  strcpy(param_values[4],rnum_s);
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",
           ((double)iVar1 / 2147483647.0) * 0.8999999761581421 + 0.10000000149011612);
  strcpy(param_values[5],rnum_s);
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",((double)iVar1 / 2147483647.0) * 5.0 + 0.0);
  strcpy(param_values[6],rnum_s);
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",((double)iVar1 / 2147483647.0) * 5.0 + 0.0);
  strcpy(param_values[7],rnum_s);
  iVar1 = rand();
  snprintf(rnum_s,0x100,"%.1f",((double)iVar1 / 2147483647.0) * 5.0 + 0.0);
  strcpy(param_values[8],rnum_s);
  regenerate = 1;
  return;
}

Assistant:

static char const *rnum(float min, float max)
{
   static char s[256];
   double x = rand() / (double)RAND_MAX;
   x = min + x * (max - min);
   snprintf(s, sizeof s, "%.1f", x);
   return s;
}